

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.h
# Opt level: O0

CResult * __thiscall CConsole::CResult::operator=(CResult *this,CResult *Other)

{
  CResult *in_RSI;
  CResult *in_RDI;
  uint i;
  IResult *in_stack_ffffffffffffffd8;
  uint local_14;
  
  if (in_RDI != in_RSI) {
    IConsole::IResult::operator=(&in_RDI->super_IResult,in_stack_ffffffffffffffd8);
    mem_copy(in_RDI,in_stack_ffffffffffffffd8,0);
    in_RDI->m_pArgsStart =
         in_RSI->m_pArgsStart + (0x90 - (long)in_RSI->m_aStringStorage) +
         (long)&in_RDI->super_IResult;
    in_RDI->m_pCommand =
         in_RSI->m_pCommand + (0x90 - (long)in_RSI->m_aStringStorage) + (long)&in_RDI->super_IResult
    ;
    for (local_14 = 0; local_14 < (in_RSI->super_IResult).m_NumArgs; local_14 = local_14 + 1) {
      in_RDI->m_apArgs[local_14] =
           in_RSI->m_apArgs[local_14] + (0x90 - (long)in_RSI->m_aStringStorage) +
           (long)&in_RDI->super_IResult;
    }
  }
  return in_RDI;
}

Assistant:

CResult &operator =(const CResult &Other)
		{
			if(this != &Other)
			{
				IResult::operator=(Other);
				mem_copy(m_aStringStorage, Other.m_aStringStorage, sizeof(m_aStringStorage));
				m_pArgsStart = m_aStringStorage+(Other.m_pArgsStart-Other.m_aStringStorage);
				m_pCommand = m_aStringStorage+(Other.m_pCommand-Other.m_aStringStorage);
				for(unsigned i = 0; i < Other.m_NumArgs; ++i)
					m_apArgs[i] = m_aStringStorage+(Other.m_apArgs[i]-Other.m_aStringStorage);
			}
			return *this;
		}